

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

isofile * isofile_new(archive_write *a,archive_entry *entry)

{
  archive_entry *paVar1;
  isofile *file;
  archive_entry *entry_local;
  archive_write *a_local;
  
  a_local = (archive_write *)calloc(1,200);
  if (a_local == (archive_write *)0x0) {
    a_local = (archive_write *)0x0;
  }
  else {
    if (entry == (archive_entry *)0x0) {
      paVar1 = archive_entry_new2(&a->archive);
      *(archive_entry **)&(a_local->archive).compression_code = paVar1;
    }
    else {
      paVar1 = archive_entry_clone(entry);
      *(archive_entry **)&(a_local->archive).compression_code = paVar1;
    }
    if (*(long *)&(a_local->archive).compression_code == 0) {
      free(a_local);
      a_local = (archive_write *)0x0;
    }
    else {
      (a_local->archive).compression_name = (char *)0x0;
      (a_local->archive).file_count = 0;
      (a_local->archive).archive_error_number = 0;
      (a_local->archive).error = (char *)0x0;
      (a_local->archive).error_string.s = (char *)0x0;
      (a_local->archive).error_string.length = 0;
      (a_local->archive).error_string.buffer_length = 0;
      (a_local->archive).current_code = (char *)0x0;
      (a_local->archive).current_codepage = 0;
      (a_local->archive).current_oemcp = 0;
      (a_local->archive).sconv = (archive_string_conv *)0x0;
      (a_local->archive).read_data_block = (char *)0x0;
      (a_local->archive).read_data_offset = 0;
      (a_local->archive).read_data_output_offset = 0;
      a_local->skip_file_ino = (int64_t)&(a_local->archive).read_data_is_posix_read;
    }
  }
  return (isofile *)a_local;
}

Assistant:

static struct isofile *
isofile_new(struct archive_write *a, struct archive_entry *entry)
{
	struct isofile *file;

	file = calloc(1, sizeof(*file));
	if (file == NULL)
		return (NULL);

	if (entry != NULL)
		file->entry = archive_entry_clone(entry);
	else
		file->entry = archive_entry_new2(&a->archive);
	if (file->entry == NULL) {
		free(file);
		return (NULL);
	}
	archive_string_init(&(file->parentdir));
	archive_string_init(&(file->basename));
	archive_string_init(&(file->basename_utf16));
	archive_string_init(&(file->symlink));
	file->cur_content = &(file->content);

	return (file);
}